

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PropValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,propVal);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string PropValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(propVal);
}